

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O2

JsonnetJsonValue * jsonnet_json_make_number(JsonnetVm *vm,double v)

{
  JsonnetJsonValue *this;
  
  this = (JsonnetJsonValue *)operator_new(0x78);
  *(undefined8 *)this = 0;
  (this->string)._M_dataplus._M_p = (pointer)0x0;
  (this->string)._M_string_length = 0;
  (this->string).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->string).field_2 + 8) = 0;
  this->number = 0.0;
  (this->elements).
  super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->elements).
  super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->elements).
  super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->fields)._M_t._M_impl = 0;
  *(undefined8 *)&(this->fields)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->fields)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  JsonnetJsonValue::JsonnetJsonValue(this);
  this->kind = NUMBER;
  this->number = v;
  return this;
}

Assistant:

JsonnetJsonValue *jsonnet_json_make_number(struct JsonnetVm *vm, double v)
{
    (void)vm;
    JsonnetJsonValue *r = new JsonnetJsonValue();
    r->kind = JsonnetJsonValue::NUMBER;
    r->number = v;
    return r;
}